

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

void __thiscall
gl4cts::CopyImage::FunctionalTest::prepareTestCases
          (FunctionalTest *this,GLenum dst_internal_format,GLenum dst_target,
          GLenum src_internal_format,GLenum src_target)

{
  GLuint GVar1;
  GLuint GVar2;
  bool bVar3;
  bool bVar4;
  GLenum GVar5;
  GLenum GVar6;
  GLenum GVar7;
  GLenum GVar8;
  GLuint GVar9;
  GLuint GVar10;
  long lVar11;
  bool bVar12;
  value_type local_90;
  long local_40;
  long local_38;
  
  bVar3 = Utils::isTargetMultilevel(dst_target);
  bVar4 = Utils::isTargetMultilevel(src_target);
  GVar5 = Utils::getFormat(dst_internal_format);
  GVar6 = Utils::getType(dst_internal_format);
  GVar7 = Utils::getFormat(src_internal_format);
  GVar8 = Utils::getType(src_internal_format);
  for (GVar9 = 0; GVar9 != (uint)bVar4 * 2 + 1; GVar9 = GVar9 + 1) {
    for (GVar10 = 0; GVar10 != (uint)bVar3 * 2 + 1; GVar10 = GVar10 + 1) {
      for (local_40 = 0; local_40 != 2; local_40 = local_40 + 1) {
        GVar1 = prepareTestCases::image_dimmensions[local_40];
        for (local_38 = 0; local_38 != 2; local_38 = local_38 + 1) {
          GVar2 = prepareTestCases::image_dimmensions[local_38];
          bVar12 = local_38 != 0;
          for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 4) {
            local_90.m_width = *(GLuint *)((long)prepareTestCases::region_dimmensions + lVar11);
            local_90.m_dst_y = GVar2 - local_90.m_width;
            local_90.m_dst_x = GVar2 - local_90.m_width;
            local_90.m_src_x = 0;
            local_90.m_src_y = 0;
            local_90.m_dst.m_target = dst_target;
            local_90.m_dst.m_width = GVar2;
            local_90.m_dst.m_height = GVar2;
            local_90.m_dst.m_level = GVar10;
            local_90.m_dst.m_internal_format = dst_internal_format;
            local_90.m_dst.m_format = GVar5;
            local_90.m_dst.m_type = GVar6;
            local_90.m_src.m_target = src_target;
            local_90.m_src.m_width = GVar1;
            local_90.m_src.m_height = GVar1;
            local_90.m_src.m_level = GVar9;
            local_90.m_src.m_internal_format = src_internal_format;
            local_90.m_src.m_format = GVar7;
            local_90.m_src.m_type = GVar8;
            local_90.m_height = local_90.m_width;
            std::
            vector<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
            ::push_back(&this->m_test_cases,&local_90);
            if (bVar12 && GVar2 == GVar1) {
              local_90.m_dst_x = 0;
              local_90.m_dst_y = 0;
              local_90.m_src_x = 0;
              local_90.m_src_y = 0;
              local_90.m_width = GVar1;
              local_90.m_height = GVar1;
              std::
              vector<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
              ::push_back(&this->m_test_cases,&local_90);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void FunctionalTest::prepareTestCases(GLenum dst_internal_format, GLenum dst_target, GLenum src_internal_format,
									  GLenum src_target)
{
	static const GLuint image_dimmensions[] = {
		7,
#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_IMG_DIM
		8,
		9,
		10,
		11,
		12,
		13,
		14,
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_IMG_DIM */
		15
	};

	static const GLuint region_dimmensions[] = {
		1,
#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_DIM
		2,
		3,
		4,
		5,
		6,
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_DIM */
		7
	};

	static const GLuint n_image_dimmensions  = sizeof(image_dimmensions) / sizeof(image_dimmensions[0]);
	static const GLuint n_region_dimmensions = sizeof(region_dimmensions) / sizeof(region_dimmensions[0]);

	const bool   is_dst_multi_level = Utils::isTargetMultilevel(dst_target);
	const bool   is_src_multi_level = Utils::isTargetMultilevel(src_target);
	const GLenum dst_format			= Utils::getFormat(dst_internal_format);
	const GLuint dst_n_levels		= (true == is_dst_multi_level) ? FUNCTIONAL_TEST_N_LEVELS : 1;
	const GLenum dst_type			= Utils::getType(dst_internal_format);
	const GLenum src_format			= Utils::getFormat(src_internal_format);
	const GLuint src_n_levels		= (true == is_src_multi_level) ? FUNCTIONAL_TEST_N_LEVELS : 1;
	const GLenum src_type			= Utils::getType(src_internal_format);

	for (GLuint src_level = 0; src_level < src_n_levels; ++src_level)
	{
		for (GLuint dst_level = 0; dst_level < dst_n_levels; ++dst_level)
		{
			for (GLuint src_img_dim_id = 0; src_img_dim_id < n_image_dimmensions; ++src_img_dim_id)
			{
				const GLuint src_image_dimmension = image_dimmensions[src_img_dim_id];

				for (GLuint dst_img_dim_id = 0; dst_img_dim_id < n_image_dimmensions; ++dst_img_dim_id)
				{
					const GLuint dst_image_dimmension = image_dimmensions[dst_img_dim_id];

					for (GLuint reg_dim_id = 0; reg_dim_id < n_region_dimmensions; ++reg_dim_id)
					{
						const GLuint region_dimmension = region_dimmensions[reg_dim_id];
						GLuint		 dst_coord[3]	  = { 0, 0, 0 };
						const GLuint dst_dim_diff	  = dst_image_dimmension - region_dimmension;
						GLuint		 n_dst_coords	  = 1;
#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS
						GLuint n_src_coords = 1;
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS */
						GLuint		 src_coord[3] = { 0, 0, 0 };
						const GLuint src_dim_diff = src_image_dimmension - region_dimmension;

						/* Calculate coords */
						if (1 == dst_dim_diff)
						{
							dst_coord[1] = 1;
							n_dst_coords = 2;
						}
						else if (1 < dst_dim_diff)
						{
							dst_coord[1] = dst_dim_diff / 2;
							dst_coord[2] = dst_dim_diff;
							n_dst_coords = 3;
						}

						if (1 == src_dim_diff)
						{
							src_coord[1] = 1;
#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS
							n_src_coords = 2;
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS */
						}
						else if (1 < src_dim_diff)
						{
							src_coord[1] = src_dim_diff / 2;
							src_coord[2] = src_dim_diff;
#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS
							n_src_coords = 3;
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS */
						}

						testCase test_case = {
							{									/* m_dst */
							  dst_target, dst_image_dimmension, /* width */
							  dst_image_dimmension,				/* height */
							  dst_level, dst_internal_format, dst_format, dst_type },
							0,									/* dst_x */
							0,									/* dst_y */
							{									/* m_src */
							  src_target, src_image_dimmension, /* width */
							  src_image_dimmension,				/* height */
							  src_level, src_internal_format, src_format, src_type },
							0,				   /* src_x */
							0,				   /* src_y */
							region_dimmension, /* width */
							region_dimmension, /* height */
						};

#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS
						for (GLuint src_x = 0; src_x < n_src_coords; ++src_x)
						{
							for (GLuint src_y = 0; src_y < n_src_coords; ++src_y)
							{
								for (GLuint dst_x = 0; dst_x < n_dst_coords; ++dst_x)
								{
									for (GLuint dst_y = 0; dst_y < n_dst_coords; ++dst_y)
									{
										test_case.m_dst_x = dst_coord[dst_x];
										test_case.m_dst_y = dst_coord[dst_y];
										test_case.m_src_x = src_coord[src_x];
										test_case.m_src_y = src_coord[src_y];

										m_test_cases.push_back(test_case);
									}
								}
							}
						}
#else  /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS */
						test_case.m_dst_x = dst_coord[n_dst_coords - 1];
						test_case.m_dst_y = dst_coord[n_dst_coords - 1];
						test_case.m_src_x = src_coord[0];
						test_case.m_src_y = src_coord[0];

						m_test_cases.push_back(test_case);
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS */

						/* Whole image, for non 7x7 */
						if ((dst_image_dimmension == src_image_dimmension) &&
							(image_dimmensions[0] != dst_image_dimmension))
						{
							test_case.m_dst_x  = 0;
							test_case.m_dst_y  = 0;
							test_case.m_src_x  = 0;
							test_case.m_src_y  = 0;
							test_case.m_width  = dst_image_dimmension;
							test_case.m_height = dst_image_dimmension;

							m_test_cases.push_back(test_case);
						}
					}
				}
			}
		}
	}
}